

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaFx.c
# Opt level: O1

int Gia_ManFactorNode(Gia_Man_t *p,char *pSop,Vec_Int_t *vLeaves)

{
  int iVar1;
  Dec_Graph_t *pFForm;
  
  iVar1 = Kit_PlaGetVarNum(pSop);
  if (iVar1 == 0) {
    iVar1 = Kit_PlaIsConst0(pSop);
    return (uint)(iVar1 < 1);
  }
  iVar1 = Kit_PlaGetVarNum(pSop);
  if (iVar1 != vLeaves->nSize) {
    __assert_fail("Kit_PlaGetVarNum(pSop) == Vec_IntSize(vLeaves)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/aig/gia/giaFx.c"
                  ,0x75,"int Gia_ManFactorNode(Gia_Man_t *, char *, Vec_Int_t *)");
  }
  iVar1 = Kit_PlaGetVarNum(pSop);
  if ((iVar1 < 3) || (iVar1 = Kit_PlaGetCubeNum(pSop), iVar1 < 2)) {
    iVar1 = Gia_ManSopToAig(p,pSop,vLeaves);
    return iVar1;
  }
  pFForm = Dec_Factor(pSop);
  iVar1 = Gia_ManFactorGraph(p,pFForm,vLeaves);
  if (pFForm->pNodes != (Dec_Node_t *)0x0) {
    free(pFForm->pNodes);
    pFForm->pNodes = (Dec_Node_t *)0x0;
  }
  if (pFForm == (Dec_Graph_t *)0x0) {
    return iVar1;
  }
  free(pFForm);
  return iVar1;
}

Assistant:

int Gia_ManFactorNode( Gia_Man_t * p, char * pSop, Vec_Int_t * vLeaves )
{
    if ( Kit_PlaGetVarNum(pSop) == 0 )
        return Abc_LitNotCond( 1, Kit_PlaIsConst0(pSop) );
    assert( Kit_PlaGetVarNum(pSop) == Vec_IntSize(vLeaves) );
    if ( Kit_PlaGetVarNum(pSop) > 2 && Kit_PlaGetCubeNum(pSop) > 1 )
    {
        Dec_Graph_t * pFForm = Dec_Factor( pSop );
        int Lit = Gia_ManFactorGraph( p, pFForm, vLeaves );
        Dec_GraphFree( pFForm );
        return Lit;
    }
    return Gia_ManSopToAig( p, pSop, vLeaves );
}